

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

sqlite3_pcache_page * pcache1Fetch(sqlite3_pcache *p,uint iKey,int createFlag)

{
  int *piVar1;
  void *pvVar2;
  void *pvVar3;
  sqlite3_pcache_page *psVar4;
  PgHdr1 *pPVar5;
  
  psVar4 = *(sqlite3_pcache_page **)
            (*(long *)(p + 0x40) + ((ulong)iKey % (ulong)*(uint *)(p + 0x3c)) * 8);
  while( true ) {
    if (psVar4 == (sqlite3_pcache_page *)0x0) {
      if (createFlag != 0) {
        pPVar5 = pcache1FetchStage2((PCache1 *)p,iKey,createFlag);
        return &pPVar5->page;
      }
      return (sqlite3_pcache_page *)0x0;
    }
    if (*(uint *)&psVar4[1].pBuf == iKey) break;
    psVar4 = (sqlite3_pcache_page *)psVar4[1].pExtra;
  }
  pvVar2 = psVar4[2].pExtra;
  if (pvVar2 != (void *)0x0) {
    pvVar3 = psVar4[3].pBuf;
    *(void **)((long)pvVar3 + 0x28) = pvVar2;
    *(void **)((long)pvVar2 + 0x30) = pvVar3;
    psVar4[2].pExtra = (void *)0x0;
    piVar1 = (int *)((long)psVar4[2].pBuf + 0x34);
    *piVar1 = *piVar1 + -1;
  }
  return psVar4;
}

Assistant:

static sqlite3_pcache_page *pcache1Fetch(
  sqlite3_pcache *p, 
  unsigned int iKey, 
  int createFlag
){
#if PCACHE1_MIGHT_USE_GROUP_MUTEX || defined(SQLITE_DEBUG)
  PCache1 *pCache = (PCache1 *)p;
#endif

  assert( offsetof(PgHdr1,page)==0 );
  assert( pCache->bPurgeable || createFlag!=1 );
  assert( pCache->bPurgeable || pCache->nMin==0 );
  assert( pCache->bPurgeable==0 || pCache->nMin==10 );
  assert( pCache->nMin==0 || pCache->bPurgeable );
  assert( pCache->nHash>0 );
#if PCACHE1_MIGHT_USE_GROUP_MUTEX
  if( pCache->pGroup->mutex ){
    return (sqlite3_pcache_page*)pcache1FetchWithMutex(p, iKey, createFlag);
  }else
#endif
  {
    return (sqlite3_pcache_page*)pcache1FetchNoMutex(p, iKey, createFlag);
  }
}